

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint64_t uVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 uVar11;
  uint64_t v;
  size_t sVar12;
  ctrl_t cVar13;
  ulong uVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58.heap.control = (common->heap_or_soo_).heap.control;
    local_58.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar7 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,true,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x10,0x20);
    if ((local_48 != 0) && (!bVar7)) {
      if ((char)local_3f == '\x01') {
        __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7ea,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
      sVar12 = 0;
      sVar10 = local_48;
      uVar11 = local_58.heap.slot_array;
      do {
        if ((char)local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7e6,
                        "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
        }
        if (kSentinel < local_58.heap.control[sVar12]) {
          uVar3 = *(ulong *)uVar11;
          uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                            (&hash_internal::MixingHashState::kSeed,*(ulong *)(uVar11 + 8),uVar3);
          uVar14 = (uVar8 ^ uVar3) * -0x234dd359734ecb13;
          FVar15 = find_first_non_full<void>
                             (common,uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                     (uVar14 & 0xff0000000000) >> 0x18 |
                                     (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
                                     (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
                                     uVar14 << 0x38);
          uVar9 = FVar15.offset;
          uVar3 = common->capacity_;
          if (uVar3 <= uVar9) {
            __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x744,
                          "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                         );
          }
          cVar13 = (ctrl_t)(uVar14 >> 0x38) & ~kEmpty;
          pcVar4 = (common->heap_or_soo_).heap.control;
          pcVar4[uVar9] = cVar13;
          pcVar4[(ulong)((uint)uVar3 & 0xf) + (uVar9 - 0xf & uVar3)] = cVar13;
          common->capacity_ = 0xffffffffffffff9c;
          uVar14 = *(ulong *)uVar11;
          uVar5 = *(ulong *)(uVar11 + 8);
          uVar6 = *(ulong *)(uVar11 + 0x18);
          puVar1 = (ulong *)(lVar2 + 0x10 + uVar9 * 0x20);
          *puVar1 = *(ulong *)(uVar11 + 0x10);
          puVar1[1] = uVar6;
          puVar1 = (ulong *)(lVar2 + uVar9 * 0x20);
          *puVar1 = uVar14;
          puVar1[1] = uVar5;
          CommonFields::set_capacity(common,uVar3);
          sVar10 = local_48;
        }
        sVar12 = sVar12 + 1;
        uVar11 = uVar11 + 0x20;
      } while (sVar12 != sVar10);
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }